

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning_tree_main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  __pid_t _Var3;
  ostream *poVar4;
  int *piVar5;
  char *pcVar6;
  undefined8 uVar7;
  long in_RSI;
  int in_EDI;
  vw_exception *e;
  ofstream pid_file;
  SpanningTree spanningTree;
  char __errmsg [256];
  stringstream __msg;
  SpanningTree *in_stack_00000ab0;
  SpanningTree *in_stack_fffffffffffffab0;
  string *in_stack_fffffffffffffac8;
  int in_stack_fffffffffffffad4;
  char *in_stack_fffffffffffffad8;
  vw_exception *in_stack_fffffffffffffae0;
  ostream local_4e8 [543];
  undefined1 local_2c9;
  char local_2a8 [272];
  stringstream local_198 [16];
  ostream local_188 [376];
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  if (2 < in_EDI) {
    poVar4 = std::operator<<((ostream *)&std::cout,"usage: spanning_tree [--nondaemon | pid_file]");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  local_10 = in_RSI;
  local_8 = in_EDI;
  if (((in_EDI != 2) || (iVar2 = strcmp("--nondaemon",*(char **)(in_RSI + 8)), iVar2 != 0)) &&
     (iVar2 = daemon(1,1), iVar2 != 0)) {
    std::__cxx11::stringstream::stringstream(local_198);
    std::operator<<(local_188,"daemon: ");
    piVar5 = __errno_location();
    pcVar6 = strerror_r(*piVar5,local_2a8,0x100);
    if (pcVar6 == (char *)0x0) {
      poVar4 = std::operator<<(local_188,"errno = ");
      std::operator<<(poVar4,local_2a8);
    }
    else {
      std::operator<<(local_188,"errno = unknown");
    }
    local_2c9 = 1;
    uVar7 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad4,
               in_stack_fffffffffffffac8);
    local_2c9 = 0;
    __cxa_throw(uVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  VW::SpanningTree::SpanningTree((SpanningTree *)__errmsg._96_8_);
  if ((local_8 == 2) && (iVar2 = strcmp("--nondaemon",*(char **)(local_10 + 8)), iVar2 != 0)) {
    std::ofstream::ofstream(local_4e8);
    std::ofstream::open(local_4e8,*(undefined8 *)(local_10 + 8),0x10);
    bVar1 = std::ofstream::is_open();
    if ((bVar1 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"error writing pid file");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    _Var3 = getpid();
    poVar4 = (ostream *)std::ostream::operator<<(local_4e8,_Var3);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ofstream::close();
    std::ofstream::~ofstream(local_4e8);
  }
  VW::SpanningTree::Run(in_stack_00000ab0);
  VW::SpanningTree::~SpanningTree(in_stack_fffffffffffffab0);
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{ if (argc > 2)
  { cout << "usage: spanning_tree [--nondaemon | pid_file]" << endl;
    exit(0);
  }

  try
  { if (argc == 2 && strcmp("--nondaemon",argv[1])==0)
      ;
    else if (daemon(1,1))
      THROWERRNO("daemon: ");

    SpanningTree spanningTree;

    if (argc == 2 && strcmp("--nondaemon",argv[1])!=0)
    { ofstream pid_file;
      pid_file.open(argv[1]);
      if (!pid_file.is_open())
      { cerr << "error writing pid file" << endl;
        exit(1);
      }
      pid_file << getpid() << endl;
      pid_file.close();
    }

    spanningTree.Run();
  }
  catch (VW::vw_exception& e)
  { cerr << "spanning tree (" << e.Filename() << ":" << e.LineNumber() << "): " << e.what() << endl;
  }
}